

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  int iVar1;
  long lVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  undefined4 in_register_00000014;
  QTreeWidgetItem *this_00;
  long in_FS_OFFSET;
  int guess;
  int row;
  QTreeWidgetItem *par;
  QTreeWidgetItem *itm;
  QTreeWidgetItem **in_stack_ffffffffffffffa8;
  QTreeModel *pQVar5;
  QTreeWidgetItem *local_30;
  
  this_00 = (QTreeWidgetItem *)CONCAT44(in_register_00000014,__c);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = this;
  executePendingSort(this);
  if ((this_00 == (QTreeWidgetItem *)0x0) ||
     (this_00 == *(QTreeWidgetItem **)((QAbstractItemModel *)__s + 0x10))) {
    QModelIndex::QModelIndex((QModelIndex *)0x90e9bf);
  }
  else {
    local_30 = QTreeWidgetItem::parent(this_00);
    if (local_30 == (QTreeWidgetItem *)0x0) {
      local_30 = *(QTreeWidgetItem **)((QAbstractItemModel *)__s + 0x10);
    }
    iVar1 = this_00->d->rowGuess;
    if (((iVar1 < 0) ||
        (qVar3 = QList<QTreeWidgetItem_*>::size(&local_30->children), qVar3 <= iVar1)) ||
       (ppQVar4 = QList<QTreeWidgetItem_*>::at
                            ((QList<QTreeWidgetItem_*> *)this,(qsizetype)in_stack_ffffffffffffffa8),
       *ppQVar4 != this_00)) {
      qVar3 = QListSpecialMethodsBase<QTreeWidgetItem*>::lastIndexOf<QTreeWidgetItem*>
                        ((QListSpecialMethodsBase<QTreeWidgetItem_*> *)this,
                         in_stack_ffffffffffffffa8,0x90ea6b);
      this_00->d->rowGuess = (int)qVar3;
    }
    QAbstractItemModel::createIndex
              ((QAbstractItemModel *)__s,(int)((ulong)pQVar5 >> 0x20),(int)pQVar5,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (char *)pQVar5;
}

Assistant:

QModelIndex QTreeModel::index(const QTreeWidgetItem *item, int column) const
{
    executePendingSort();

    if (!item || (item == rootItem))
        return QModelIndex();
    const QTreeWidgetItem *par = item->parent();
    QTreeWidgetItem *itm = const_cast<QTreeWidgetItem*>(item);
    if (!par)
        par = rootItem;
    int row;
    int guess = item->d->rowGuess;
    if (guess >= 0
        && par->children.size() > guess
        && par->children.at(guess) == itm) {
        row = guess;
    } else {
        row = par->children.lastIndexOf(itm);
        itm->d->rowGuess = row;
    }
    return createIndex(row, column, itm);
}